

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O3

void * __thiscall btGenericPoolAllocator::allocate(btGenericPoolAllocator *this,size_t size_bytes)

{
  void *pvVar1;
  ulong uVar2;
  bool bVar3;
  
  if (this->m_pool_count != 0) {
    uVar2 = 1;
    do {
      pvVar1 = btGenericMemoryPool::allocate(this->m_pools[uVar2 - 1],size_bytes);
      if (pvVar1 != (void *)0x0) break;
      bVar3 = uVar2 < this->m_pool_count;
      uVar2 = uVar2 + 1;
    } while (bVar3);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
  }
  pvVar1 = failback_alloc(this,size_bytes);
  return pvVar1;
}

Assistant:

void * btGenericPoolAllocator::allocate(size_t size_bytes)
{
	void * ptr = NULL;

	size_t i = 0;
	while(i<m_pool_count && ptr == NULL)
	{
		ptr = m_pools[i]->allocate(size_bytes);
		++i;
	}

	if(ptr) return ptr;

	return failback_alloc(size_bytes);
}